

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_movep(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg1;
  uint32_t uVar1;
  uint uVar2;
  TCGTemp *pTVar3;
  TCGv_i32 *ppTVar4;
  byte bVar5;
  uintptr_t o;
  TCGv_i32 ret;
  uintptr_t o_1;
  TCGv_i32 pTVar6;
  short local_3c;
  
  s_00 = s->uc->tcg_ctx;
  uVar1 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  uVar2 = insn & 7;
  if (((uint)s->writeback_mask >> uVar2 & 1) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar4 = s->writeback;
  }
  pTVar6 = ppTVar4[uVar2];
  arg1 = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(insn >> 6 & 0x38));
  pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)pTVar3 - (long)s_00);
  local_3c = (short)uVar1;
  tcg_gen_addi_i32_m68k(s_00,ret,pTVar6,(int)local_3c);
  pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  pTVar6 = (TCGv_i32)((long)pTVar3 - (long)s_00);
  bVar5 = (char)((insn & 0x40) >> 6) * '\x02' + 2;
  if ((char)insn < '\0') {
    while( true ) {
      tcg_gen_shri_i32_m68k(s_00,pTVar6,arg1,(uint)bVar5 * 8 + -8);
      tcg_gen_qemu_st_i32_m68k
                (s_00,pTVar6,ret,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),MO_8);
      if (bVar5 == 1) break;
      tcg_gen_addi_i32_m68k(s_00,ret,ret,2);
      bVar5 = bVar5 - 1;
    }
  }
  else {
    while( true ) {
      tcg_gen_qemu_ld_i32_m68k
                (s_00,pTVar6,ret,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),MO_8);
      tcg_gen_deposit_i32_m68k(s_00,arg1,arg1,pTVar6,(uint)bVar5 * 8 - 8,8);
      if (bVar5 == 1) break;
      tcg_gen_addi_i32_m68k(s_00,ret,ret,2);
      bVar5 = bVar5 - 1;
    }
  }
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
  return;
}

Assistant:

DISAS_INSN(movep)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint8_t i;
    int16_t displ;
    TCGv reg;
    TCGv addr;
    TCGv abuf;
    TCGv dbuf;

    displ = read_im16(env, s);

    addr = AREG(insn, 0);
    reg = DREG(insn, 9);

    abuf = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_i32(tcg_ctx, abuf, addr, displ);
    dbuf = tcg_temp_new(tcg_ctx);

    if (insn & 0x40) {
        i = 4;
    } else {
        i = 2;
    }

    if (insn & 0x80) {
        for ( ; i > 0 ; i--) {
            tcg_gen_shri_i32(tcg_ctx, dbuf, reg, (i - 1) * 8);
            tcg_gen_qemu_st8(tcg_ctx, dbuf, abuf, IS_USER(s));
            if (i > 1) {
                tcg_gen_addi_i32(tcg_ctx, abuf, abuf, 2);
            }
        }
    } else {
        for ( ; i > 0 ; i--) {
            tcg_gen_qemu_ld8u(tcg_ctx, dbuf, abuf, IS_USER(s));
            tcg_gen_deposit_i32(tcg_ctx, reg, reg, dbuf, (i - 1) * 8, 8);
            if (i > 1) {
                tcg_gen_addi_i32(tcg_ctx, abuf, abuf, 2);
            }
        }
    }
    tcg_temp_free(tcg_ctx, abuf);
    tcg_temp_free(tcg_ctx, dbuf);
}